

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

void __thiscall
CLI::App::_parse(App *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  Option *pOVar1;
  pointer puVar2;
  Option *pOVar3;
  App *this_00;
  bool bVar4;
  INIError *__return_storage_ptr__;
  char *pcVar5;
  _Rb_tree_node_base *p_Var6;
  size_t sVar7;
  RequiresError *this_01;
  ExcludesError *this_02;
  RequiredError *pRVar8;
  ArgumentMismatch *__return_storage_ptr___00;
  CallForHelp *this_03;
  ExtrasError *this_04;
  pointer puVar9;
  Option_p *opt;
  allocator local_19a;
  bool positional_only;
  App *local_198;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  string local_70;
  string local_50;
  
  this->parsed_ = true;
  positional_only = false;
  while ((args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start !=
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish) {
    _parse_single(this,args,&positional_only);
  }
  pOVar1 = this->help_ptr_;
  if ((pOVar1 != (Option *)0x0) &&
     ((pOVar1->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pOVar1->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    this_03 = (CallForHelp *)__cxa_allocate_exception(0x38);
    CallForHelp::CallForHelp(this_03);
    __cxa_throw(this_03,&CallForHelp::typeinfo,Error::~Error);
  }
  pOVar1 = this->config_ptr_;
  local_198 = this;
  if (pOVar1 != (Option *)0x0) {
    if ((pOVar1->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pOVar1->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      Option::run_callback(pOVar1);
      this->config_required_ = true;
    }
    if ((this->config_name_)._M_string_length != 0) {
      detail::parse_ini((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                        &selected_subcommands,&this->config_name_);
      while (selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        bVar4 = _parse_ini(this,(vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                                 *)&selected_subcommands);
        if (!bVar4) {
          __return_storage_ptr__ = (INIError *)__cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string
                    ((string *)&local_70,
                     (string *)
                     (selected_subcommands.
                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_finish + -8));
          INIError::Extras(__return_storage_ptr__,&local_70);
          __cxa_throw(__return_storage_ptr__,&INIError::typeinfo,Error::~Error);
        }
      }
      std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::~vector
                ((vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *)
                 &selected_subcommands);
    }
  }
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1) {
    pOVar1 = (puVar9->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((*(pointer *)
          ((long)&(pOVar1->results_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          + 8) == *(pointer *)
                   &(pOVar1->results_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl) && ((pOVar1->envname_)._M_string_length != 0)) {
      selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&selected_subcommands.
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      pcVar5 = getenv((((puVar9->_M_t).
                        super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                        super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                        super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->envname_).
                      _M_dataplus._M_p);
      if (pcVar5 != (char *)0x0) {
        ::std::__cxx11::string::string((string *)&local_90,pcVar5,&local_19a);
        ::std::__cxx11::string::operator=((string *)&selected_subcommands,(string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        if (selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl
            .super__Vector_impl_data._M_finish != (pointer)0x0) {
          pOVar1 = (puVar9->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          ::std::__cxx11::string::string((string *)&local_50,(string *)&selected_subcommands);
          Option::add_result(pOVar1,&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
      }
      ::std::__cxx11::string::~string((string *)&selected_subcommands);
    }
  }
  puVar2 = (local_198->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (local_198->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1) {
    pOVar1 = (puVar9->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((*(pointer *)
          ((long)&(pOVar1->results_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          + 8) != (pOVar1->results_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) && (pOVar1->callback_run_ == false)) {
      Option::run_callback(pOVar1);
    }
  }
  puVar9 = (local_198->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (local_198->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    this_00 = local_198;
    if (puVar9 == puVar2) {
      get_subcommands(&selected_subcommands,local_198,true);
      if ((ulong)((long)selected_subcommands.
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)selected_subcommands.
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) < this_00->require_subcommand_min_) {
        pRVar8 = (RequiredError *)__cxa_allocate_exception(0x38);
        RequiredError::Subcommand(pRVar8,this_00->require_subcommand_min_);
        __cxa_throw(pRVar8,&RequiredError::typeinfo,Error::~Error);
      }
      if ((this_00->allow_extras_ == false) && (this_00->prefix_command_ == false)) {
        sVar7 = remaining_size(this_00,false);
        if (sVar7 != 0) {
          remaining_abi_cxx11_(&local_90,this_00,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(args,&local_90);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_90);
          ::std::
          __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
          this_04 = (ExtrasError *)__cxa_allocate_exception(0x38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_168,args);
          ExtrasError::ExtrasError(this_04,&local_168);
          __cxa_throw(this_04,&ExtrasError::typeinfo,Error::~Error);
        }
      }
      std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base
                (&selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>);
      return;
    }
    pOVar1 = (puVar9->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    bVar4 = (pOVar1->super_OptionBase<CLI::Option>).required_;
    if ((bVar4 != false) ||
       (*(pointer *)
         ((long)&(pOVar1->results_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         + 8) != *(pointer *)
                  &(pOVar1->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl)) {
      if (pOVar1->expected_ < 0) {
        if ((ulong)((long)*(pointer *)
                           ((long)&(pOVar1->results_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           + 8) -
                    *(long *)&(pOVar1->results_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl >> 5) < (ulong)(uint)-pOVar1->expected_) {
          __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::single_name_abi_cxx11_
                    (&local_b0,
                     (puVar9->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          ArgumentMismatch::AtLeast
                    (__return_storage_ptr___00,&local_b0,
                     -((puVar9->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->expected_);
          __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,Error::~Error);
        }
      }
      if ((bVar4 != false) &&
         (*(pointer *)
           ((long)&(pOVar1->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 8) == *(pointer *)
                    &(pOVar1->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl)) {
        pRVar8 = (RequiredError *)__cxa_allocate_exception(0x38);
        Option::single_name_abi_cxx11_
                  ((string *)&selected_subcommands,
                   (puVar9->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        ::std::operator+(&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &selected_subcommands," is required");
        RequiredError::RequiredError(pRVar8,&local_d0);
        __cxa_throw(pRVar8,&RequiredError::typeinfo,Error::~Error);
      }
    }
    for (p_Var6 = *(_Base_ptr *)((long)&(pOVar1->requires_)._M_t + 0x18);
        p_Var6 != (_Rb_tree_node_base *)((long)&(pOVar1->requires_)._M_t + 8U);
        p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6)) {
      if (*(pointer *)
           ((long)&(pOVar1->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 8) != *(pointer *)
                    &(pOVar1->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl) {
        pOVar3 = *(Option **)(p_Var6 + 1);
        if ((pOVar3->results_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (pOVar3->results_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          this_01 = (RequiresError *)__cxa_allocate_exception(0x38);
          Option::single_name_abi_cxx11_
                    (&local_f0,
                     (puVar9->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          Option::single_name_abi_cxx11_(&local_110,pOVar3);
          RequiresError::RequiresError(this_01,&local_f0,&local_110);
          __cxa_throw(this_01,&RequiresError::typeinfo,Error::~Error);
        }
      }
    }
    for (p_Var6 = *(_Base_ptr *)((long)&(pOVar1->excludes_)._M_t + 0x18);
        p_Var6 != (_Rb_tree_node_base *)((long)&(pOVar1->excludes_)._M_t + 8U);
        p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6)) {
      if (*(pointer *)
           ((long)&(pOVar1->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 8) != *(pointer *)
                    &(pOVar1->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl) {
        pOVar3 = *(Option **)(p_Var6 + 1);
        if ((pOVar3->results_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (pOVar3->results_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          this_02 = (ExcludesError *)__cxa_allocate_exception(0x38);
          Option::single_name_abi_cxx11_
                    (&local_130,
                     (puVar9->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          Option::single_name_abi_cxx11_(&local_150,pOVar3);
          ExcludesError::ExcludesError(this_02,&local_130,&local_150);
          __cxa_throw(this_02,&ExcludesError::typeinfo,Error::~Error);
        }
      }
    }
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

void _parse(std::vector<std::string> &args) {
        parsed_ = true;
        bool positional_only = false;

        while(!args.empty()) {
            _parse_single(args, positional_only);
        }

        if(help_ptr_ != nullptr && help_ptr_->count() > 0) {
            throw CallForHelp();
        }

        // Process an INI file
        if(config_ptr_ != nullptr) {
            if(*config_ptr_) {
                config_ptr_->run_callback();
                config_required_ = true;
            }
            if(!config_name_.empty()) {
                try {
                    std::vector<detail::ini_ret_t> values = detail::parse_ini(config_name_);
                    while(!values.empty()) {
                        if(!_parse_ini(values)) {
                            throw INIError::Extras(values.back().fullname);
                        }
                    }
                } catch(const FileError &) {
                    if(config_required_)
                        throw;
                }
            }
        }

        // Get envname options if not yet passed
        for(const Option_p &opt : options_) {
            if(opt->count() == 0 && !opt->envname_.empty()) {
                char *buffer = nullptr;
                std::string ename_string;

#ifdef _MSC_VER
                // Windows version
                size_t sz = 0;
                if(_dupenv_s(&buffer, &sz, opt->envname_.c_str()) == 0 && buffer != nullptr) {
                    ename_string = std::string(buffer);
                    free(buffer);
                }
#else
                // This also works on Windows, but gives a warning
                buffer = std::getenv(opt->envname_.c_str());
                if(buffer != nullptr)
                    ename_string = std::string(buffer);
#endif

                if(!ename_string.empty()) {
                    opt->add_result(ename_string);
                }
            }
        }

        // Process callbacks
        for(const Option_p &opt : options_) {
            if(opt->count() > 0 && !opt->get_callback_run()) {
                opt->run_callback();
            }
        }

        // Verify required options
        for(const Option_p &opt : options_) {
            // Required or partially filled
            if(opt->get_required() || opt->count() != 0) {
                // Make sure enough -N arguments parsed (+N is already handled in parsing function)
                if(opt->get_expected() < 0 && opt->count() < static_cast<size_t>(-opt->get_expected()))
                    throw ArgumentMismatch::AtLeast(opt->single_name(), -opt->get_expected());

                // Required but empty
                if(opt->get_required() && opt->count() == 0)
                    throw RequiredError(opt->single_name() + " is required");
            }
            // Requires
            for(const Option *opt_req : opt->requires_)
                if(opt->count() > 0 && opt_req->count() == 0)
                    throw RequiresError(opt->single_name(), opt_req->single_name());
            // Excludes
            for(const Option *opt_ex : opt->excludes_)
                if(opt->count() > 0 && opt_ex->count() != 0)
                    throw ExcludesError(opt->single_name(), opt_ex->single_name());
        }

        auto selected_subcommands = get_subcommands();
        if(require_subcommand_min_ > selected_subcommands.size())
            throw RequiredError::Subcommand(require_subcommand_min_);

        // Convert missing (pairs) to extras (string only)
        if(!(allow_extras_ || prefix_command_)) {
            size_t num_left_over = remaining_size();
            if(num_left_over > 0) {
                args = remaining(false);
                std::reverse(std::begin(args), std::end(args));
                throw ExtrasError(args);
            }
        }
    }